

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask3_8(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 3 | *out;
  *out = in[2] << 6 | *out;
  *out = in[3] << 9 | *out;
  *out = in[4] << 0xc | *out;
  *out = in[5] << 0xf | *out;
  *out = in[6] << 0x12 | *out;
  *out = in[7] << 0x15 | *out;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask3_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;

  return out + 1;
}